

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O3

uint mpack_node_uint(mpack_node_t node)

{
  mpack_type_t mVar1;
  anon_union_8_7_c87e5bf0_for_value aVar2;
  float fVar3;
  mpack_tree_t *pmVar4;
  
  pmVar4 = node.tree;
  fVar3 = 0.0;
  if (pmVar4->error == mpack_ok) {
    mVar1 = (node.data)->type;
    if (((mVar1 == mpack_type_int) || (mVar1 == mpack_type_uint)) &&
       (aVar2 = (node.data)->value, aVar2.u >> 0x20 == 0)) {
      fVar3 = aVar2.f;
    }
    else {
      pmVar4->error = mpack_error_type;
      fVar3 = 0.0;
      if (pmVar4->error_fn != (mpack_tree_error_t)0x0) {
        (*pmVar4->error_fn)(pmVar4,mpack_error_type);
      }
    }
  }
  return (uint)fVar3;
}

Assistant:

MPACK_INLINE unsigned int mpack_node_uint(mpack_node_t node) {

    // This should be true at compile-time, so this just wraps the 32-bit function.
    if (sizeof(unsigned int) == 4)
        return (unsigned int)mpack_node_u32(node);

    // Otherwise we use u64 and check the range.
    uint64_t val = mpack_node_u64(node);
    if (val <= UINT_MAX)
        return (unsigned int)val;

    mpack_node_flag_error(node, mpack_error_type);
    return 0;
}